

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_leaf.cpp
# Opt level: O0

void duckdb::BaseLeaf<(unsigned_char)'\x0f',_(duckdb::NType)9>::InsertByteInternal
               (BaseLeaf<(unsigned_char)__x0f_,_(duckdb::NType)9> *n,uint8_t byte)

{
  bool bVar1;
  uint8_t i;
  uint8_t child_pos;
  uint8_t byte_local;
  BaseLeaf<(unsigned_char)__x0f_,_(duckdb::NType)9> *n_local;
  
  child_pos = '\0';
  while( true ) {
    bVar1 = false;
    if (child_pos < n->count) {
      bVar1 = n->key[child_pos] < byte;
    }
    if (!bVar1) break;
    child_pos = child_pos + '\x01';
  }
  for (i = n->count; child_pos < i; i = i + 0xff) {
    n->key[i] = n->key[(int)(i - 1)];
  }
  n->key[child_pos] = byte;
  n->count = n->count + '\x01';
  return;
}

Assistant:

void BaseLeaf<CAPACITY, TYPE>::InsertByteInternal(BaseLeaf &n, const uint8_t byte) {
	// Still space. Insert the child.
	uint8_t child_pos = 0;
	while (child_pos < n.count && n.key[child_pos] < byte) {
		child_pos++;
	}

	// Move children backwards to make space.
	for (uint8_t i = n.count; i > child_pos; i--) {
		n.key[i] = n.key[i - 1];
	}

	n.key[child_pos] = byte;
	n.count++;
}